

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_Stream.cc
# Opt level: O2

void __thiscall qpdf::Stream::setDictDescription(Stream *this)

{
  QPDFObject *this_00;
  QPDF *owning_qpdf;
  bool bVar1;
  Members *pMVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_58;
  string local_38;
  
  pMVar2 = stream(this);
  bVar1 = QPDFObjectHandle::hasObjectDescription(&pMVar2->stream_dict);
  if (!bVar1) {
    this_00 = (this->super_BaseHandle).obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    owning_qpdf = this_00->qpdf;
    QPDFObject::getDescription_abi_cxx11_(&local_38,this_00);
    std::operator+(&bStack_58,&local_38," -> stream dictionary");
    QPDFObjectHandle::setObjectDescription(&pMVar2->stream_dict,owning_qpdf,&bStack_58);
    std::__cxx11::string::~string((string *)&bStack_58);
    std::__cxx11::string::~string((string *)&local_38);
  }
  return;
}

Assistant:

void
qpdf::Stream::setDictDescription()
{
    auto s = stream();
    if (!s->stream_dict.hasObjectDescription()) {
        s->stream_dict.setObjectDescription(
            obj->getQPDF(), obj->getDescription() + " -> stream dictionary");
    }
}